

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  char *__s1;
  char *p;
  char **argv_local;
  int argc_local;
  
  reset(0x800);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "welcome to malloc-simulator(best-fit), enter \'help\' to get some help!"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  while( true ) {
    do {
      std::operator<<((ostream *)&std::cout,"malloc-simulator$");
      memset(buffer,0,0x400);
      std::istream::getline((char *)&std::cin,0x10b170);
      __s1 = strtok(buffer," ");
    } while (__s1 == (char *)0x0);
    iVar1 = strcmp(__s1,"exit");
    if (iVar1 == 0) break;
    iVar1 = strcmp(__s1,"setMemSize");
    if (iVar1 == 0) {
      setMemSize();
    }
    else {
      iVar1 = strcmp(__s1,"showMemInfo");
      if (iVar1 == 0) {
        showMemInfo();
      }
      else {
        iVar1 = strcmp(__s1,"showProcessInfo");
        if (iVar1 == 0) {
          showProcessInfo();
        }
        else {
          iVar1 = strcmp(__s1,"newProcess");
          if (iVar1 == 0) {
            newProcess();
          }
          else {
            iVar1 = strcmp(__s1,"deleteProcess");
            if (iVar1 == 0) {
              deleteProcess();
            }
            else {
              iVar1 = strcmp(__s1,"help");
              if (iVar1 == 0) {
                help();
              }
              else {
                iVar1 = strcmp(__s1,"about");
                if (iVar1 == 0) {
                  about();
                }
                else {
                  iVar1 = strcmp(__s1,"reset");
                  if (iVar1 == 0) {
                    reset(memSize);
                  }
                  else {
                    poVar2 = std::operator<<((ostream *)&std::cout,"unknown instruction!");
                    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    // 重置程序
    reset(DEFAULT_MEM_SIZE);

    char *p = NULL;

    cout << WELCOME << endl;

    // 进入主循环
    while (true) {
        cout << PROMPT;
        // 清空缓冲区
        memset(buffer, 0, BUFFER_SIZE);
        // 读入一行
        cin.getline(buffer, BUFFER_SIZE);
        // 分割字符串
        p = strtok(buffer, " ");
        if (p) {
            // 根据不同的指令做不同的事情
            if (!strcmp(p, "exit")) {
                break;
            } else if (!strcmp(p, "setMemSize")) {
                setMemSize();
            } else if (!strcmp(p, "showMemInfo")) {
                showMemInfo();
            } else if (!strcmp(p, "showProcessInfo")) {
                showProcessInfo();
            } else if (!strcmp(p, "newProcess")) {
                newProcess();
            } else if (!strcmp(p, "deleteProcess")) {
                deleteProcess();
            } else if (!strcmp(p, "help")) {
                help();
            } else if (!strcmp(p, "about")) {
                about();
            } else if (!strcmp(p, "reset")) {
                reset(memSize);
            } else {
                cout << "unknown instruction!" << endl;
            }
        }
    }

    return 0;
}